

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

bool __thiscall
async_simple::coro::detail::LazyAwaiterBase<bool>::awaitResume(LazyAwaiterBase<bool> *this)

{
  bool bVar1;
  bool *pbVar2;
  coroutine_handle<async_simple::coro::detail::LazyPromise<bool>_> *in_RDI;
  bool r;
  
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<bool>_>::promise(in_RDI);
  pbVar2 = LazyPromise<bool>::result((LazyPromise<bool> *)this);
  bVar1 = *pbVar2;
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<bool>_>::destroy
            ((coroutine_handle<async_simple::coro::detail::LazyPromise<bool>_> *)0x289670);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<bool>_>::operator=
            (in_RDI,(nullptr_t)0x0);
  return (bool)(bVar1 & 1);
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }